

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBaseDebugState::~cmFindBaseDebugState(cmFindBaseDebugState *this)

{
  cmFindBase *pcVar1;
  string_view sep;
  bool bVar2;
  ulong uVar3;
  cmAlphaNum local_888;
  cmAlphaNum local_858;
  string local_828;
  cmAlphaNum local_808;
  cmAlphaNum local_7d8;
  string local_7a8;
  cmAlphaNum local_788;
  cmAlphaNum local_758;
  string local_728;
  cmAlphaNum local_708;
  cmAlphaNum local_6d8;
  undefined1 local_6a8 [8];
  string path;
  DebugLibState *state;
  iterator __end2;
  iterator __begin2;
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  *__range2;
  cmAlphaNum local_638;
  string local_608;
  bool local_5e4;
  bool local_5e3;
  bool local_5e2;
  bool local_5e1;
  cmAlphaNum local_5e0;
  cmAlphaNum local_5b0;
  string local_580;
  cmAlphaNum local_560;
  cmAlphaNum local_530;
  string local_500;
  cmAlphaNum local_4e0;
  cmAlphaNum local_4b0;
  string local_480;
  cmAlphaNum local_460;
  cmAlphaNum local_430;
  string local_400;
  cmAlphaNum local_3e0;
  cmAlphaNum local_3b0;
  string local_380;
  cmAlphaNum local_360;
  cmAlphaNum local_330;
  string local_300;
  cmAlphaNum local_2e0;
  cmAlphaNum local_2b0;
  string local_280;
  cmAlphaNum local_260;
  cmAlphaNum local_230;
  string local_200;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  string_view local_1d0;
  string_view local_1c0;
  string local_1b0;
  cmAlphaNum local_190;
  cmAlphaNum local_160;
  string local_130;
  cmAlphaNum local_110;
  cmAlphaNum local_e0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string buffer;
  cmFindBaseDebugState *this_local;
  
  buffer.field_2._8_8_ = this;
  if (((this->FindCommand->super_cmFindCommon).DebugMode & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_60,&this->CommandName);
    cmAlphaNum::cmAlphaNum(&local_90," called with the following settings:\n");
    cmStrCat<>((string *)local_30,&local_60,&local_90);
    cmAlphaNum::cmAlphaNum(&local_e0,"  VAR: ");
    cmAlphaNum::cmAlphaNum(&local_110,&this->FindCommand->VariableName);
    cmStrCat<char[2]>(&local_b0,&local_e0,&local_110,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    cmAlphaNum::cmAlphaNum(&local_160,"  NAMES: ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"\"");
    pcVar1 = this->FindCommand;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,"\"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1e0,"\n         ");
    sep._M_str = local_1e0._M_str;
    sep._M_len = local_1e0._M_len;
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_1b0,local_1c0,&pcVar1->Names,local_1d0,sep);
    cmAlphaNum::cmAlphaNum(&local_190,&local_1b0);
    cmStrCat<char[2]>(&local_130,&local_160,&local_190,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1b0);
    cmAlphaNum::cmAlphaNum(&local_230,"  Documentation: ");
    cmAlphaNum::cmAlphaNum(&local_260,&this->FindCommand->VariableDocumentation);
    cmStrCat<char[2]>(&local_200,&local_230,&local_260,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::operator+=((string *)local_30,"  Framework\n");
    cmAlphaNum::cmAlphaNum(&local_2b0,"    Only Search Frameworks: ");
    cmAlphaNum::cmAlphaNum
              (&local_2e0,(this->FindCommand->super_cmFindCommon).SearchFrameworkOnly & 1);
    cmStrCat<char[2]>(&local_280,&local_2b0,&local_2e0,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    cmAlphaNum::cmAlphaNum(&local_330,"    Search Frameworks Last: ");
    cmAlphaNum::cmAlphaNum
              (&local_360,(this->FindCommand->super_cmFindCommon).SearchFrameworkLast & 1);
    cmStrCat<char[2]>(&local_300,&local_330,&local_360,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    cmAlphaNum::cmAlphaNum(&local_3b0,"    Search Frameworks First: ");
    cmAlphaNum::cmAlphaNum
              (&local_3e0,(this->FindCommand->super_cmFindCommon).SearchFrameworkFirst & 1);
    cmStrCat<char[2]>(&local_380,&local_3b0,&local_3e0,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::operator+=((string *)local_30,"  AppBundle\n");
    cmAlphaNum::cmAlphaNum(&local_430,"    Only Search AppBundle: ");
    cmAlphaNum::cmAlphaNum
              (&local_460,(this->FindCommand->super_cmFindCommon).SearchAppBundleOnly & 1);
    cmStrCat<char[2]>(&local_400,&local_430,&local_460,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    cmAlphaNum::cmAlphaNum(&local_4b0,"    Search AppBundle Last: ");
    cmAlphaNum::cmAlphaNum
              (&local_4e0,(this->FindCommand->super_cmFindCommon).SearchAppBundleLast & 1);
    cmStrCat<char[2]>(&local_480,&local_4b0,&local_4e0,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    cmAlphaNum::cmAlphaNum(&local_530,"    Search AppBundle First: ");
    cmAlphaNum::cmAlphaNum
              (&local_560,(this->FindCommand->super_cmFindCommon).SearchAppBundleFirst & 1);
    cmStrCat<char[2]>(&local_500,&local_530,&local_560,(char (*) [2])0xde26c0);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    if (((this->FindCommand->super_cmFindCommon).NoDefaultPath & 1U) == 0) {
      cmAlphaNum::cmAlphaNum(&local_5b0,"  CMAKE_FIND_USE_CMAKE_PATH: ");
      cmAlphaNum::cmAlphaNum
                (&local_5e0,(byte)~(this->FindCommand->super_cmFindCommon).NoCMakePath & 1);
      local_5e1 = (bool)(~(this->FindCommand->super_cmFindCommon).NoCMakeEnvironmentPath & 1);
      local_5e2 = (bool)(~(this->FindCommand->super_cmFindCommon).NoSystemEnvironmentPath & 1);
      local_5e3 = (bool)(~(this->FindCommand->super_cmFindCommon).NoCMakeSystemPath & 1);
      local_5e4 = (bool)(~(this->FindCommand->super_cmFindCommon).NoCMakeInstallPath & 1);
      cmStrCat<char[2],char[42],bool,char[2],char[43],bool,char[2],char[37],bool,char[2],char[34],bool,char[2]>
                (&local_580,&local_5b0,&local_5e0,(char (*) [2])0xde26c0,
                 (char (*) [42])"  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",&local_5e1,
                 (char (*) [2])0xde26c0,(char (*) [43])"  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
                 &local_5e2,(char (*) [2])0xde26c0,
                 (char (*) [37])"  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",&local_5e3,
                 (char (*) [2])0xde26c0,(char (*) [34])"  CMAKE_FIND_USE_INSTALL_PREFIX: ",
                 &local_5e4,(char (*) [2])0xde26c0);
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_580);
      std::__cxx11::string::~string((string *)&local_580);
    }
    else {
      std::__cxx11::string::operator+=((string *)local_30,"  NO_DEFAULT_PATH Enabled\n");
    }
    cmAlphaNum::cmAlphaNum(&local_638,&this->CommandName);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range2," considered the following locations:\n");
    cmStrCat<>(&local_608,&local_638,(cmAlphaNum *)&__range2);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    __end2 = std::
             vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
             ::begin(&this->FailedSearchLocations);
    state = (DebugLibState *)
            std::
            vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
            ::end(&this->FailedSearchLocations);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmFindBaseDebugState::DebugLibState_*,_std::vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>_>
                                  *)&state);
      if (!bVar2) break;
      path.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<cmFindBaseDebugState::DebugLibState_*,_std::vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>_>
           ::operator*(&__end2);
      cmAlphaNum::cmAlphaNum(&local_6d8,"  ");
      cmAlphaNum::cmAlphaNum(&local_708,(string *)(path.field_2._8_8_ + 0x20));
      cmStrCat<>((string *)local_6a8,&local_6d8,&local_708);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cmAlphaNum::cmAlphaNum(&local_758,(string *)local_6a8);
        cmAlphaNum::cmAlphaNum(&local_788,"/");
        cmStrCat<std::__cxx11::string>
                  (&local_728,&local_758,&local_788,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   path.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_6a8,(string *)&local_728);
        std::__cxx11::string::~string((string *)&local_728);
      }
      cmAlphaNum::cmAlphaNum(&local_7d8,(string *)local_6a8);
      cmAlphaNum::cmAlphaNum(&local_808,"\n");
      cmStrCat<>(&local_7a8,&local_7d8,&local_808);
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_7a8);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::__cxx11::string::~string((string *)local_6a8);
      __gnu_cxx::
      __normal_iterator<cmFindBaseDebugState::DebugLibState_*,_std::vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>_>
      ::operator++(&__end2);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_858,"The item was found at\n  ");
      cmAlphaNum::cmAlphaNum(&local_888,&(this->FoundSearchLocation).path);
      cmStrCat<char[2]>(&local_828,&local_858,&local_888,(char (*) [2])0xde26c0);
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_828);
      std::__cxx11::string::~string((string *)&local_828);
    }
    else {
      std::__cxx11::string::operator+=((string *)local_30,"The item was not found.\n");
    }
    cmFindCommon::DebugMessage(&this->FindCommand->super_cmFindCommon,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  DebugLibState::~DebugLibState(&this->FoundSearchLocation);
  std::
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ::~vector(&this->FailedSearchLocations);
  std::__cxx11::string::~string((string *)&this->CommandName);
  return;
}

Assistant:

cmFindBaseDebugState::~cmFindBaseDebugState()
{
  if (this->FindCommand->DebugMode) {
    std::string buffer =
      cmStrCat(this->CommandName, " called with the following settings:\n");
    buffer += cmStrCat("  VAR: ", this->FindCommand->VariableName, "\n");
    buffer += cmStrCat(
      "  NAMES: ", cmWrap("\"", this->FindCommand->Names, "\"", "\n         "),
      "\n");
    buffer += cmStrCat(
      "  Documentation: ", this->FindCommand->VariableDocumentation, "\n");
    buffer += "  Framework\n";
    buffer += cmStrCat("    Only Search Frameworks: ",
                       this->FindCommand->SearchFrameworkOnly, "\n");

    buffer += cmStrCat("    Search Frameworks Last: ",
                       this->FindCommand->SearchFrameworkLast, "\n");
    buffer += cmStrCat("    Search Frameworks First: ",
                       this->FindCommand->SearchFrameworkFirst, "\n");
    buffer += "  AppBundle\n";
    buffer += cmStrCat("    Only Search AppBundle: ",
                       this->FindCommand->SearchAppBundleOnly, "\n");
    buffer += cmStrCat("    Search AppBundle Last: ",
                       this->FindCommand->SearchAppBundleLast, "\n");
    buffer += cmStrCat("    Search AppBundle First: ",
                       this->FindCommand->SearchAppBundleFirst, "\n");

    if (this->FindCommand->NoDefaultPath) {
      buffer += "  NO_DEFAULT_PATH Enabled\n";
    } else {
      buffer += cmStrCat(
        "  CMAKE_FIND_USE_CMAKE_PATH: ", !this->FindCommand->NoCMakePath, "\n",
        "  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoCMakeEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoSystemEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
        !this->FindCommand->NoCMakeSystemPath, "\n",
        "  CMAKE_FIND_USE_INSTALL_PREFIX: ",
        !this->FindCommand->NoCMakeInstallPath, "\n");
    }

    buffer +=
      cmStrCat(this->CommandName, " considered the following locations:\n");
    for (auto const& state : this->FailedSearchLocations) {
      std::string path = cmStrCat("  ", state.path);
      if (!state.regexName.empty()) {
        path = cmStrCat(path, "/", state.regexName);
      }
      buffer += cmStrCat(path, "\n");
    }

    if (!this->FoundSearchLocation.path.empty()) {
      buffer += cmStrCat("The item was found at\n  ",
                         this->FoundSearchLocation.path, "\n");
    } else {
      buffer += "The item was not found.\n";
    }

    this->FindCommand->DebugMessage(buffer);
  }
}